

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O1

void __thiscall
icu_63::CollationBuilder::closeOverComposites(CollationBuilder *this,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  UnicodeString *str;
  UnicodeString prefix;
  UnicodeSetIterator iter;
  UnicodeString nfdString;
  UnicodeSet composites;
  ConstChar16Ptr local_160;
  char16_t *local_158;
  UnicodeString local_148;
  UnicodeSetIterator local_108;
  UnicodeString local_c8;
  UnicodeSet local_88;
  
  local_160.p_ = L"[:NFD_QC=N:]";
  UnicodeString::UnicodeString(&local_148,'\x01',&local_160,-1);
  UnicodeSet::UnicodeSet(&local_88,&local_148,errorCode);
  UnicodeString::~UnicodeString(&local_148);
  local_158 = local_160.p_;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    UnicodeSet::remove(&local_88,(char *)0xac00);
    local_148.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003f7be0;
    local_148.fUnion.fStackFields.fLengthAndFlags = 2;
    local_c8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003f7be0;
    local_c8.fUnion.fStackFields.fLengthAndFlags = 2;
    UnicodeSetIterator::UnicodeSetIterator(&local_108,&local_88);
    while( true ) {
      UVar1 = UnicodeSetIterator::next(&local_108);
      if (UVar1 == '\0') break;
      (*(this->nfd->super_UObject)._vptr_UObject[7])
                (this->nfd,(ulong)(uint)local_108.codepoint,&local_c8);
      iVar2 = CollationDataBuilder::getCEs(this->dataBuilder,&local_c8,this->ces,0);
      this->cesLength = iVar2;
      if (iVar2 < 0x20) {
        str = UnicodeSetIterator::getString(&local_108);
        addIfDifferent(this,&local_148,str,this->ces,this->cesLength,0xffffffff,errorCode);
      }
    }
    UnicodeSetIterator::~UnicodeSetIterator(&local_108);
    UnicodeString::~UnicodeString(&local_c8);
    UnicodeString::~UnicodeString(&local_148);
  }
  UnicodeSet::~UnicodeSet(&local_88);
  return;
}

Assistant:

void
CollationBuilder::closeOverComposites(UErrorCode &errorCode) {
    UnicodeSet composites(UNICODE_STRING_SIMPLE("[:NFD_QC=N:]"), errorCode);  // Java: static final
    if(U_FAILURE(errorCode)) { return; }
    // Hangul is decomposed on the fly during collation.
    composites.remove(Hangul::HANGUL_BASE, Hangul::HANGUL_END);
    UnicodeString prefix;  // empty
    UnicodeString nfdString;
    UnicodeSetIterator iter(composites);
    while(iter.next()) {
        U_ASSERT(!iter.isString());
        nfd.getDecomposition(iter.getCodepoint(), nfdString);
        cesLength = dataBuilder->getCEs(nfdString, ces, 0);
        if(cesLength > Collation::MAX_EXPANSION_LENGTH) {
            // Too many CEs from the decomposition (unusual), ignore this composite.
            // We could add a capacity parameter to getCEs() and reallocate if necessary.
            // However, this can only really happen in contrived cases.
            continue;
        }
        const UnicodeString &composite(iter.getString());
        addIfDifferent(prefix, composite, ces, cesLength, Collation::UNASSIGNED_CE32, errorCode);
    }
}